

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O2

int main(int argc,char **argv)

{
  socklen_t __len;
  __pid_t _Var1;
  reqprot_t rVar2;
  ushort uVar3;
  int iVar4;
  __pid_t _Var5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  uint *puVar11;
  char *pcVar12;
  ssize_t sVar13;
  byte *__s2;
  size_t sVar14;
  char *pcVar15;
  FILE *pFVar16;
  long lVar17;
  char *pcVar18;
  ssize_t sVar19;
  size_t __n;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  char *pcVar24;
  size_t sVar25;
  bool bVar26;
  bool bVar27;
  char *cmd;
  int num;
  int prot_minor;
  byte bStack_24c61;
  size_t count;
  int iStack_24c54;
  size_t cmdsize;
  int rtp_size;
  int iStack_24c40;
  int rtp_channel;
  int prot_major;
  int flag;
  int rtp_partno;
  char *pcStack_24c28;
  char *pcStack_24c20;
  uint uStack_24c18;
  __pid_t _Stack_24c14;
  size_t sStack_24c10;
  char *pcStack_24c08;
  char *pcStack_24c00;
  sockaddr sStack_24bf8;
  undefined4 uStack_24be8;
  undefined4 uStack_24be4;
  undefined4 uStack_24be0;
  char *endptr;
  undefined8 uStack_24b80;
  undefined8 uStack_24b78;
  undefined8 uStack_24b70;
  undefined8 uStack_24b68;
  undefined8 uStack_24b60;
  undefined8 uStack_24b58;
  undefined8 uStack_24b50;
  undefined8 uStack_24b48;
  undefined8 uStack_24b40;
  undefined1 auStack_24a84 [4];
  httprequest req;
  
  memset(&req,0,0x24a50);
  uVar3 = 8999;
  pcVar12 = ".rtsp.pid";
  iVar4 = 1;
LAB_00104c8f:
  iVar6 = iVar4;
  if (iVar6 < argc) {
    pcVar10 = argv[iVar6];
    iVar4 = strcmp("--version",pcVar10);
    if (iVar4 == 0) {
      curl_mprintf("rtspd IPv4%s\n","/IPv6");
      return 0;
    }
    iVar4 = strcmp("--pidfile",pcVar10);
    if (iVar4 == 0) {
      iVar4 = iVar6 + 1;
      if (iVar4 < argc) {
        pcVar12 = argv[iVar4];
        iVar4 = iVar6 + 2;
      }
      goto LAB_00104c8f;
    }
    iVar4 = strcmp("--logfile",pcVar10);
    if (iVar4 != 0) {
      iVar4 = strcmp("--ipv4",pcVar10);
      if (iVar4 == 0) {
        ipv_inuse = "IPv4";
        use_ipv6 = 0;
      }
      else {
        iVar4 = strcmp("--ipv6",pcVar10);
        if (iVar4 != 0) {
          iVar4 = strcmp("--port",pcVar10);
          if (iVar4 == 0) {
            iVar4 = iVar6 + 1;
            if (iVar4 < argc) {
              pcStack_24c20 = pcVar12;
              uVar7 = strtoul(argv[iVar4],&endptr,10);
              pcVar10 = endptr;
              pcVar12 = argv[iVar4];
              sVar8 = strlen(pcVar12);
              if ((pcVar10 != pcVar12 + sVar8) || (0xfbfe < uVar7 - 0x401)) {
                curl_mfprintf(_stderr,"rtspd: invalid --port argument (%s)\n",pcVar12);
                return 0;
              }
              uVar3 = curlx_ultous(uVar7);
              pcVar12 = pcStack_24c20;
              iVar4 = iVar6 + 2;
            }
          }
          else {
            iVar4 = strcmp("--srcdir",pcVar10);
            if (iVar4 != 0) {
              puts(
                  "Usage: rtspd [option]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --port [port]\n --srcdir [path]"
                  );
              return 0;
            }
            iVar4 = iVar6 + 1;
            if (iVar4 < argc) {
              path = argv[iVar4];
              iVar4 = iVar6 + 2;
            }
          }
          goto LAB_00104c8f;
        }
        ipv_inuse = "IPv6";
        use_ipv6 = 1;
      }
      iVar4 = iVar6 + 1;
      goto LAB_00104c8f;
    }
    iVar4 = iVar6 + 1;
    if (iVar4 < argc) {
      serverlogfile = argv[iVar4];
      iVar4 = iVar6 + 2;
    }
    goto LAB_00104c8f;
  }
  old_sighup_handler = (SIGHANDLER_T)signal(1,(__sighandler_t)0x1);
  if (old_sighup_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    logmsg("cannot install SIGHUP handler: %s",pcVar10);
  }
  old_sigpipe_handler = (SIGHANDLER_T)signal(0xd,(__sighandler_t)0x1);
  if (old_sigpipe_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    logmsg("cannot install SIGPIPE handler: %s",pcVar10);
  }
  old_sigalrm_handler = (SIGHANDLER_T)signal(0xe,(__sighandler_t)0x1);
  if (old_sigalrm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    logmsg("cannot install SIGALRM handler: %s",pcVar10);
  }
  old_sigint_handler = (SIGHANDLER_T)signal(2,exit_signal_handler);
  if (old_sigint_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    logmsg("cannot install SIGINT handler: %s",pcVar10);
  }
  else {
    siginterrupt(2,1);
  }
  old_sigterm_handler = (SIGHANDLER_T)signal(0xf,exit_signal_handler);
  if (old_sigterm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    logmsg("cannot install SIGTERM handler: %s",pcVar10);
  }
  else {
    siginterrupt(0xf,1);
  }
  _Var5 = getpid();
  iVar4 = socket((uint)use_ipv6 * 8 + 2,1,0);
  uVar7 = (ulong)uVar3;
  if (iVar4 == -1) {
    puVar11 = (uint *)__errno_location();
    uVar20 = *puVar11;
    pcVar10 = strerror(uVar20);
    logmsg("Error creating socket: (%d) %s",(ulong)uVar20,pcVar10);
    bVar27 = true;
    goto LAB_00105119;
  }
  flag = 1;
  iVar6 = setsockopt(iVar4,1,2,&flag,4);
  iStack_24c40 = iVar4;
  if (iVar6 == 0) {
    sStack_24bf8.sa_data._0_2_ = uVar3 << 8 | uVar3 >> 8;
    if (use_ipv6 == 0) {
      sStack_24bf8.sa_data[6] = '\0';
      sStack_24bf8.sa_data[7] = '\0';
      sStack_24bf8.sa_data[8] = '\0';
      sStack_24bf8.sa_data[9] = '\0';
      sStack_24bf8.sa_data[10] = '\0';
      sStack_24bf8.sa_data[0xb] = '\0';
      sStack_24bf8.sa_data[0xc] = '\0';
      sStack_24bf8.sa_data[0xd] = '\0';
      sStack_24bf8.sa_family = 2;
      __len = 0x10;
    }
    else {
      uStack_24be0 = 0;
      sStack_24bf8.sa_family = 10;
      sStack_24bf8.sa_data._6_4_ = SUB84(_in6addr_any,0);
      sStack_24bf8.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_24be8 = (undefined4)_poll;
      uStack_24be4 = (undefined4)((ulong)_poll >> 0x20);
      __len = 0x1c;
    }
    sStack_24bf8.sa_data[2] = '\0';
    sStack_24bf8.sa_data[3] = '\0';
    sStack_24bf8.sa_data[4] = '\0';
    sStack_24bf8.sa_data[5] = '\0';
    pcStack_24c20 = pcVar12;
    iVar6 = bind(iVar4,&sStack_24bf8,__len);
    if (iVar6 != 0) {
      puVar11 = (uint *)__errno_location();
      uVar20 = *puVar11;
      pcVar12 = strerror(uVar20);
      logmsg("Error binding socket on port %hu: (%d) %s",uVar7,(ulong)uVar20,pcVar12);
      goto LAB_00105108;
    }
    logmsg("Running %s version on port %d",ipv_inuse,uVar7);
    iVar4 = listen(iVar4,5);
    if (iVar4 != 0) {
      puVar11 = (uint *)__errno_location();
      uVar20 = *puVar11;
      pcVar12 = strerror(uVar20);
      pcVar10 = "listen() failed with error: (%d) %s";
      goto LAB_00105023;
    }
    iVar4 = write_pidfile(pcVar12);
    uVar20 = (uint)uVar3;
    _Var1 = _Var5;
    if (iVar4 == 0) goto LAB_00105108;
    do {
      _Stack_24c14 = _Var1;
      uStack_24c18 = uVar20;
      iVar4 = iStack_24c40;
      iVar6 = accept(iStack_24c40,(sockaddr *)0x0,(socklen_t *)0x0);
      if (got_exit_signal != 0) {
LAB_00106b68:
        if (iVar6 != -1 && iVar6 != iVar4) {
          close(iVar6);
        }
        bVar27 = false;
        break;
      }
      if (iVar6 == -1) {
        puVar11 = (uint *)__errno_location();
        uVar20 = *puVar11;
        pcVar12 = strerror(uVar20);
        bVar27 = false;
        logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",(ulong)uVar20,pcVar12);
        break;
      }
      set_advisor_read_lock("log/serverlogs.lock");
      serverlogslocked = '\x01';
      logmsg("====> Client connect");
      flag = 1;
      iStack_24c54 = iVar6;
      iVar4 = setsockopt(iVar6,6,1,&flag,4);
      if (iVar4 == -1) {
        logmsg("====> TCP_NODELAY failed");
      }
      req.pipelining = false;
      do {
        if (got_exit_signal != 0) break;
        pcStack_24c00 = req.reqbuf + req.checkindex;
        sVar25 = req.offset - req.checkindex;
        bStack_24c61 = req.pipelining;
        if (req.pipelining == false) {
          pcStack_24c00 = (char *)0x0;
          sVar25 = 0;
        }
        req.checkindex = 0;
        req.offset = 0;
        req.testno = -7;
        req.partno = 0;
        req.open = true;
        req.auth_req = false;
        req.auth = false;
        req.cl = 0;
        req.digest = false;
        req.ntlm = false;
        req.pipe = 0;
        req.skip = 0;
        req.rcmd = 0;
        req.protocol = RPROT_NONE;
        req.prot_version = 0;
        req.pipelining = false;
        req.rtp_buffer = (char *)0x0;
        req.rtp_buffersize = 0;
        bVar27 = true;
        sVar13 = 0;
        while ((bVar27 && (req.offset < 149999))) {
          if ((sVar25 != 0 & bStack_24c61) == 1) {
            memmove(&req,pcStack_24c00,sVar25);
            sVar13 = curlx_uztosz(sVar25);
            sVar25 = 0;
          }
          else {
            sVar8 = req.cl;
            if (req.skip == 0) {
              sVar8 = 149999 - req.offset;
            }
            sVar13 = recv(iStack_24c54,req.reqbuf + req.offset,sVar8,0);
          }
          if (got_exit_signal != 0) goto LAB_00106ac4;
          if (sVar13 == 0) {
            logmsg("Connection closed by client");
LAB_00106aa4:
            req.reqbuf[req.offset] = '\0';
            storerequest(req.reqbuf,req.offset);
            goto LAB_00106ac4;
          }
          if (sVar13 < 0) {
            puVar11 = (uint *)__errno_location();
            uVar20 = *puVar11;
            pcVar12 = strerror(uVar20);
            logmsg("recv() returned error: (%d) %s",(ulong)uVar20,pcVar12);
            goto LAB_00106aa4;
          }
          sStack_24c10 = sVar25;
          logmsg("Read %zd bytes",sVar13);
          req.offset = req.offset + sVar13;
          req.reqbuf[req.offset] = '\0';
          pcVar12 = req.reqbuf + req.checkindex;
          pcVar10 = strstr(pcVar12,"\r\n\r\n");
          logmsg("ProcessRequest() called with testno %ld and line [%s]",req.testno,pcVar12);
          lVar17 = req.testno;
          if ((req.testno == -7) &&
             (iVar4 = __isoc99_sscanf(pcVar12,"%255s %139999s %4s/%d.%d",ProcessRequest_request,
                                      &ProcessRequest_doc,&ProcessRequest_prot_str,&prot_major,
                                      &prot_minor), lVar17 = req.testno, iVar4 == 5)) {
            iVar4 = bcmp(&ProcessRequest_prot_str,"HTTP",5);
            rVar2 = RPROT_HTTP;
            if (iVar4 == 0) {
LAB_00105568:
              req.protocol = rVar2;
              uVar7 = _prot_major;
              iVar4 = prot_minor;
              uVar23 = _prot_major & 0xffffffff;
              req.prot_version = prot_major * 10 + prot_minor;
              __s2 = (byte *)strrchr((char *)&ProcessRequest_doc,0x2f);
              if (__s2 == (byte *)0x0) {
                iVar4 = __isoc99_sscanf(&req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,
                                        &prot_major,&prot_minor);
                if (iVar4 == 3) {
                  curl_msnprintf((char *)&endptr,0x100,"Received a CONNECT %s HTTP/%d.%d request",
                                 &ProcessRequest_doc,_prot_major & 0xffffffff,
                                 (ulong)(uint)prot_minor);
                  logmsg("%s",&endptr);
                  if (req.prot_version == 10) {
                    req._150032_2_ = req._150032_2_ & 0xff00;
                  }
                  iVar4 = bcmp(&ProcessRequest_doc,"bad",3);
                  if (iVar4 == 0) {
                    req.testno = -5;
                    lVar17 = req.testno;
                  }
                  else if (ProcessRequest_doc == 0x74736574) {
                    pcVar15 = strchr((char *)&ProcessRequest_doc,0x3a);
                    lVar17 = -3;
                    if ((pcVar15 != (char *)0x0) && (pcVar15[1] != 0)) {
                      iVar4 = Curl_isdigit((uint)(byte)pcVar15[1]);
                      lVar17 = -3;
                      if (iVar4 != 0) {
                        lVar17 = strtol(pcVar15 + 1,(char **)0x0,10);
                      }
                    }
                  }
                  else {
                    req.testno = -3;
                    lVar17 = req.testno;
                  }
                }
                else {
                  logmsg("Did not find test number in PATH");
                  req.testno = -1;
                  lVar17 = req.testno;
                }
                goto LAB_00105ca8;
              }
              sVar8 = strlen((char *)&ProcessRequest_doc);
              sVar14 = strlen(ProcessRequest_request);
              if (sVar14 + sVar8 < 200) {
                curl_msnprintf((char *)&endptr,0x100,"Got request: %s %s %s/%d.%d",
                               ProcessRequest_request,&ProcessRequest_doc,&ProcessRequest_prot_str,
                               uVar23);
              }
              else {
                curl_msnprintf((char *)&endptr,0x100,"Got a *HUGE* request %s/%d.%d",
                               &ProcessRequest_prot_str,uVar7 & 0xffffffff,(ulong)(uint)iVar4);
              }
              logmsg("%s",&endptr);
              iVar4 = strncmp("/verifiedserver",(char *)__s2,0xf);
              if (iVar4 == 0) {
                logmsg("Are-we-friendly question received");
                req.testno = -2;
              }
              else {
                iVar4 = strncmp("/quit",(char *)__s2,5);
                if (iVar4 == 0) {
                  logmsg("Request-to-quit received");
                  req.testno = -6;
                }
                else {
                  do {
                    __s2 = __s2 + 1;
                    if (*__s2 == 0) break;
                    iVar4 = Curl_isdigit((uint)*__s2);
                  } while (iVar4 == 0);
                  count = (size_t)__s2;
                  req.testno = strtol((char *)__s2,(char **)&count,10);
                  if (req.testno < 0x2711) {
                    req.partno = 0;
                  }
                  else {
                    req.partno = (ulong)req.testno % 10000;
                    req.testno = (ulong)req.testno / 10000;
                  }
                  curl_msnprintf((char *)&endptr,0x100,"Requested test number %ld part %ld",
                                 req.testno);
                  logmsg("%s",&endptr);
                  pcVar15 = test2file(req.testno);
                  pFVar16 = fopen64(pcVar15,"rb");
                  if (pFVar16 == (FILE *)0x0) {
                    puVar11 = (uint *)__errno_location();
                    uVar20 = *puVar11;
                    pcVar12 = strerror(uVar20);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar20,pcVar12);
                    logmsg("Error opening file: %s",pcVar15);
                    logmsg("Couldn\'t open test file %ld");
                    req._150032_2_ = req._150032_2_ & 0xff00;
                  }
                  else {
                    cmd = (char *)0x0;
                    cmdsize = 0;
                    num = 0;
                    rtp_channel = 0;
                    rtp_size = 0;
                    rtp_partno = -1;
                    iVar4 = getpart(&cmd,&cmdsize,"reply","servercmd",(FILE *)pFVar16);
                    fclose(pFVar16);
                    pcVar15 = cmd;
                    if (iVar4 == 0) {
                      count = (size_t)cmd;
                      if (cmdsize != 0) {
                        logmsg("Found a reply-servercmd section!");
                        do {
                          iVar4 = strncmp("auth_required",pcVar15,0xd);
                          if (iVar4 == 0) {
                            logmsg("instructed to require authorization header");
                            req.auth_req = true;
                          }
                          else {
                            iVar4 = strncmp("idle",pcVar15,4);
                            if (iVar4 == 0) {
                              logmsg("instructed to idle");
                              req.rcmd = 1;
                              req.open = true;
                            }
                            else {
                              iVar4 = strncmp("stream",pcVar15,6);
                              if (iVar4 == 0) {
                                logmsg("instructed to stream");
                                req.rcmd = 2;
                              }
                              else {
                                iVar4 = __isoc99_sscanf(pcVar15,"pipe: %d",&num);
                                if (iVar4 == 1) {
                                  logmsg("instructed to allow a pipe size of %d",(ulong)(uint)num);
                                  if (num < 0) {
                                    logmsg("negative pipe size ignored");
                                  }
                                  else if (num != 0) {
                                    req.pipe = num + -1;
                                  }
                                }
                                else {
                                  iVar4 = __isoc99_sscanf(pcVar15,"skip: %d",&num);
                                  if (iVar4 == 1) {
                                    logmsg("instructed to skip this number of bytes %d",
                                           (ulong)(uint)num);
                                    req.skip = num;
                                  }
                                  else {
                                    iVar4 = __isoc99_sscanf(pcVar15,
                                                  "rtp: part %d channel %d size %d",&rtp_partno,
                                                  &rtp_channel,&rtp_size);
                                    if (iVar4 == 3) {
                                      if (req.partno == rtp_partno) {
                                        logmsg("RTP: part %d channel %d size %d",(long)rtp_partno,
                                               (ulong)(uint)rtp_channel,(ulong)(uint)rtp_size);
                                        iVar4 = rtp_size;
                                        pcStack_24c28 = (char *)(ulong)(uint)rtp_size;
                                        lVar21 = (long)rtp_size;
                                        pcVar18 = (char *)malloc(lVar21 + 0x10);
                                        *pcVar18 = '$';
                                        pcVar18[1] = (char)rtp_channel;
                                        pcVar18[2] = (char)((uint)iVar4 >> 8);
                                        pcVar18[3] = (char)iVar4;
                                        for (lVar17 = 0; lVar17 < lVar21; lVar17 = lVar17 + 0xc) {
                                          builtin_strncpy(pcVar18 + lVar17 + 4,"$_1234\n",8);
                                          builtin_strncpy(pcVar18 + lVar17 + 0xc,"asdf",4);
                                        }
                                        if (req.rtp_buffer == (char *)0x0) {
                                          req.rtp_buffersize = lVar21 + 4;
                                          pcVar24 = pcStack_24c28;
                                        }
                                        else {
                                          pcStack_24c28 =
                                               (char *)realloc(req.rtp_buffer,
                                                               lVar21 + req.rtp_buffersize + 4);
                                          sVar25 = req.rtp_buffersize;
                                          pcVar24 = (char *)(long)rtp_size;
                                          memcpy(pcStack_24c28 + req.rtp_buffersize,pcVar18,
                                                 (size_t)(pcVar24 + 4));
                                          pcStack_24c08 = pcVar24 + sVar25 + 4;
                                          free(pcVar18);
                                          pcVar18 = pcStack_24c28;
                                          req.rtp_buffersize = (size_t)pcStack_24c08;
                                        }
                                        req.rtp_buffer = pcVar18;
                                        logmsg("rtp_buffersize is %zu, rtp_size is %d.",
                                               req.rtp_buffersize,pcVar24);
                                      }
                                    }
                                    else {
                                      logmsg("funny instruction found: %s",pcVar15);
                                    }
                                  }
                                }
                              }
                            }
                          }
                          pcVar18 = strchr(pcVar15,10);
                          if (pcVar18 == (char *)0x0) {
                            pcVar15 = (char *)0x0;
                            break;
                          }
                          pcVar15 = pcVar18 + 1;
                        } while (pcVar18[1] != '\0');
                        count = (size_t)pcVar15;
                        logmsg("Done parsing server commands");
                      }
                      free(cmd);
                      lVar17 = req.testno;
                      goto LAB_00105ca8;
                    }
                    logmsg("getpart() failed with error: %d");
                    req._150032_2_ = req._150032_2_ & 0xff00;
                  }
                }
              }
            }
            else {
              iVar4 = bcmp(&ProcessRequest_prot_str,"RTSP",5);
              rVar2 = RPROT_RTSP;
              if (iVar4 == 0) goto LAB_00105568;
              req.protocol = RPROT_NONE;
              logmsg("got unknown protocol %s");
            }
            bVar26 = true;
LAB_00106111:
            sVar25 = sStack_24c10;
            if (got_exit_signal != 0) goto LAB_00106ac4;
            bVar27 = true;
            if (bVar26) {
              bVar27 = false;
              if (req.pipe != 0) {
                logmsg("Waiting for another piped request");
                req.pipe = req.pipe + -1;
                bVar27 = true;
              }
            }
          }
          else {
LAB_00105ca8:
            req.testno = lVar17;
            if (pcVar10 != (char *)0x0) {
              logmsg("ProcessRequest found a complete request");
              if (req.pipe != 0) {
                req.checkindex = (size_t)(pcVar10 + (req.checkindex - (long)pcVar12) + 4);
              }
LAB_00105cea:
              bVar26 = true;
              if (got_exit_signal != 0) goto LAB_00106111;
              if ((req.cl != 0) ||
                 (iVar4 = Curl_strncasecompare("Content-Length:",pcVar12,0xf), iVar4 == 0)) {
                iVar4 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar12,0x1a);
                if (iVar4 == 0) goto code_r0x00105d39;
                pcVar12 = strstr(req.reqbuf,"\r\n0\r\n\r\n");
                bVar26 = pcVar12 != (char *)0x0;
                goto LAB_00106111;
              }
              pcVar12 = pcVar12 + 0xf;
              while ((*pcVar12 != 0 && (iVar4 = Curl_isspace((uint)(byte)*pcVar12), iVar4 != 0))) {
                pcVar12 = pcVar12 + 1;
              }
              endptr = pcVar12;
              piVar9 = __errno_location();
              *piVar9 = 0;
              uVar7 = strtoul(pcVar12,&endptr,10);
              if (((pcVar12 != endptr) && (iVar4 = Curl_isspace((uint)(byte)*endptr), iVar4 != 0))
                 && (*piVar9 != 0x22)) {
                req.cl = uVar7 - (long)req.skip;
                logmsg("Found Content-Length: %lu in the request",uVar7);
                if (req.skip != 0) {
                  logmsg("... but will abort after %zu bytes",req.cl);
                }
LAB_00105d4c:
                if ((req.auth == false) &&
                   (pcVar12 = strstr(req.reqbuf,"Authorization:"), pcVar12 != (char *)0x0)) {
                  req.auth = true;
                  if (req.auth_req == true) {
                    logmsg("Authorization header found, as required");
                  }
                }
                if ((req.digest == false) &&
                   (pcVar12 = strstr(req.reqbuf,"Authorization: Digest"), pcVar12 != (char *)0x0)) {
                  req.digest = true;
                  pcVar12 = "Received Digest request, sending back data %ld";
                  sVar25 = req.partno + 1000U;
                  req.partno = req.partno + 1000U;
                  goto LAB_00105fa6;
                }
                if (req.ntlm == false) {
                  pcVar12 = strstr(req.reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = strstr(req.reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
                    if (pcVar12 == (char *)0x0) goto LAB_00105e35;
                    sVar25 = req.partno + 0x3e9;
                    req.ntlm = true;
                    pcVar12 = "Received NTLM type-1, sending back data %ld";
                    req.partno = sVar25;
                  }
                  else {
                    req.partno = req.partno + 0x3ea;
                    req.ntlm = true;
                    logmsg("Received NTLM type-3, sending back data %ld");
                    if (req.cl == 0) goto LAB_00105fad;
                    pcVar12 = "  Expecting %zu POSTed bytes";
                    sVar25 = req.cl;
                  }
LAB_00105fa6:
                  logmsg(pcVar12,sVar25);
                }
                else {
LAB_00105e35:
                  lVar17 = req.partno;
                  if ((999 < req.partno) &&
                     (pcVar12 = strstr(req.reqbuf,"Authorization: Basic"), pcVar12 != (char *)0x0))
                  {
                    pcVar12 = "Received Basic request, sending back data %ld";
                    sVar25 = lVar17 + 1U;
                    req.partno = lVar17 + 1U;
                    goto LAB_00105fa6;
                  }
                }
LAB_00105fad:
                pcVar12 = strstr(req.reqbuf,"Connection: close");
                if (pcVar12 != (char *)0x0) {
                  req._150032_2_ = req._150032_2_ & 0xff00;
                }
                iVar4 = req.pipe;
                if ((((req.pipe == 0) && (req.open == true)) && (10 < req.prot_version)) &&
                   (pcVar10 + 4 < req.reqbuf + req.offset)) {
                  if ((req.reqbuf[2] == 'T' && (req.reqbuf[1] == 'E' && req.reqbuf[0] == 'G')) ||
                     (req.reqbuf._0_4_ == 0x44414548)) {
                    req.checkindex = (size_t)(pcVar10 + (4 - (long)&req));
                    req.pipelining = true;
                  }
                }
                do {
                  sVar25 = req.checkindex;
                  iVar4 = iVar4 + -1;
                  if (iVar4 == -1) {
LAB_001060bb:
                    if (((req.auth_req != true) || (req.auth == true)) && (req.cl != 0)) {
                      bVar26 = req.cl <= auStack_24a84 + (req.offset - (long)pcVar10);
                    }
                    goto LAB_00106111;
                  }
                  if (got_exit_signal != 0) goto LAB_00106111;
                  pcVar12 = req.reqbuf + req.checkindex;
                  pcVar10 = strstr(pcVar12,"\r\n\r\n");
                  if (pcVar10 == (char *)0x0) {
                    pcVar10 = (char *)0x0;
                    goto LAB_001060bb;
                  }
                  req.checkindex = (size_t)(pcVar10 + (sVar25 - (long)pcVar12) + 4);
                  req.pipe = iVar4;
                } while( true );
              }
              logmsg("Found invalid Content-Length: (%s) in the request");
              req._150032_2_ = req._150032_2_ & 0xff00;
              goto LAB_00106111;
            }
            logmsg("ProcessRequest returned without a complete request");
            bVar27 = true;
            sVar25 = sStack_24c10;
            if (got_exit_signal != 0) goto LAB_00106ac4;
          }
        }
        if ((req.offset == 149999) &&
           (pcVar12 = "Request would overflow buffer, closing connection", 0 < sVar13)) {
LAB_001061d3:
          bVar27 = false;
          logmsg(pcVar12);
          sVar25 = 149999;
        }
        else {
          bVar27 = true;
          pcVar12 = "Request buffer overflow, closing connection";
          sVar25 = req.offset;
          if (149999 < req.offset) goto LAB_001061d3;
        }
        req.reqbuf[sVar25] = '\0';
        storerequest(req.reqbuf,(&req.checkindex)[req.pipelining ^ 1]);
        if ((!bVar27) || (got_exit_signal != 0)) break;
        if (prevbounce == '\x01') {
          if ((req.testno == prevtestno) && (req.partno == prevpartno)) {
            req.partno = req.partno + 1;
            logmsg("BOUNCE part number to %ld",req.partno);
          }
          else {
            prevtestno = -1;
            prevbounce = '\0';
            prevpartno = -1;
          }
        }
        cmd = (char *)0x0;
        cmdsize = 0;
        _prot_major = 0;
        logmsg("Send response number %ld part %ld",req.testno,req.partno);
        if (req.rcmd == 1) goto LAB_00106888;
        if (req.rcmd == 2) {
          do {
            sVar19 = send(iStack_24c54,"a string to stream 01234567890\n",0x1f,0x4000);
            if (got_exit_signal != 0) goto LAB_00106888;
          } while (sVar19 == 0x1f);
          pcVar12 = "Stopped streaming";
LAB_00106309:
          logmsg(pcVar12);
        }
        else {
          req._150032_2_ = req._150032_2_ & 0xff00;
          if (req.testno < 0) {
            switch(req.testno) {
            default:
              logmsg("Replying to with a 404");
              pcVar12 = "RTSP/1.0 404 Not Found\r\nServer: curl test suite RTSP server/0.1\r\n\r\n";
              if (req.protocol == RPROT_HTTP) {
                pcVar12 = 
                "HTTP/1.1 404 Not Found\r\nServer: curl test suite RTSP server/0.1\r\nConnection: close\r\nContent-Type: text/html\r\n\r\n<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">\n<HTML><HEAD>\n<TITLE>404 Not Found</TITLE>\n</HEAD><BODY>\n<H1>Not Found</H1>\nThe requested URL was not found on this server.\n<P><HR><ADDRESS>curl test suite RTSP server/0.1</ADDRESS>\n</BODY></HTML>\n"
                ;
              }
              break;
            case -6:
              logmsg("Replying to QUIT");
              pcVar12 = "HTTP/1.1 200 Goodbye\r\n\r\n";
              break;
            case -5:
              logmsg("Replying to a bad CONNECT");
              pcVar12 = "HTTP/1.1 501 Forbidden you fool\r\n\r\n";
              break;
            case -4:
              pcVar12 = "Bailing out due to internal error";
              goto LAB_00106309;
            case -3:
              logmsg("Replying to CONNECT");
              pcVar12 = "HTTP/1.1 200 Mighty fine indeed\r\n\r\n";
              break;
            case -2:
              logmsg("Identifying ourselves as friends");
              _Var5 = getpid();
              curl_msnprintf((char *)&endptr,0x40,"RTSP_SERVER WE ROOLZ: %ld\r\n",(long)_Var5);
              sVar8 = strlen((char *)&endptr);
              curl_msnprintf(send_doc_weare,0x100,"HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s"
                             ,sVar8,&endptr);
              pcVar12 = send_doc_weare;
            }
            count = strlen(pcVar12);
LAB_00106544:
            if (got_exit_signal == 0) {
              pcVar10 = strstr(pcVar12,"swsclose");
              bVar27 = count != 0;
              if (!bVar27 || pcVar10 != (char *)0x0) {
                logmsg("connection close instruction \"swsclose\" found in response");
              }
              pcVar15 = strstr(pcVar12,"swsbounce");
              if (pcVar15 == (char *)0x0) {
                prevbounce = '\0';
              }
              else {
                prevbounce = '\x01';
                logmsg("enable \"swsbounce\" in the next request");
              }
              pFVar16 = fopen64("log/server.response","ab");
              sVar25 = count;
              if (pFVar16 == (FILE *)0x0) {
                puVar11 = (uint *)__errno_location();
                uVar20 = *puVar11;
                pcVar12 = strerror(uVar20);
                logmsg("fopen() failed with error: %d %s",(ulong)uVar20,pcVar12);
                logmsg("Error opening file: %s");
                logmsg("couldn\'t create logfile: log/server.response");
                free(cmd);
                pcVar12 = (char *)cmdsize;
LAB_0010687c:
                free(pcVar12);
              }
              else {
                do {
                  __n = count;
                  if (199 < count) {
                    __n = 200;
                  }
                  uVar7 = send(iStack_24c54,pcVar12,__n,0x4000);
                  if ((long)uVar7 < 0) break;
                  logmsg("Sent off %zd bytes",uVar7);
                  fwrite(pcVar12,1,uVar7,pFVar16);
                  if (got_exit_signal != 0) break;
                  pcVar12 = pcVar12 + uVar7;
                  count = count - uVar7;
                } while (count != 0);
                uVar7 = uVar7 >> 0x3f;
                if (req.rtp_buffer != (char *)0x0) {
                  logmsg("About to write %zu RTP bytes",req.rtp_buffersize);
                  count = req.rtp_buffersize;
                  do {
                    sVar8 = 200;
                    if (count < 200) {
                      sVar8 = count;
                    }
                    sVar19 = send(iStack_24c54,req.rtp_buffer + (req.rtp_buffersize - count),sVar8,
                                  0x4000);
                    if (sVar19 < 0) {
                      uVar7 = 1;
                      break;
                    }
                    count = count - sVar19;
                  } while (count != 0);
                  free(req.rtp_buffer);
                  req.rtp_buffersize = 0;
                }
                do {
                  iVar4 = fclose(pFVar16);
                  if (iVar4 == 0) goto LAB_001067e6;
                  puVar11 = (uint *)__errno_location();
                  uVar20 = *puVar11;
                } while (uVar20 == 4);
                pcVar12 = strerror(uVar20);
                logmsg("Error closing file %s error: %d %s","log/server.response",(ulong)uVar20,
                       pcVar12);
LAB_001067e6:
                if (got_exit_signal == 0) {
                  if ((char)uVar7 == '\0') {
                    logmsg("Response sent (%zu bytes) and written to log/server.response");
                    free(cmd);
                    pcVar12 = cmd;
                    if (_prot_major != 0) {
                      cmd = (char *)cmdsize;
                      do {
                        iVar4 = __isoc99_sscanf(cmd,"%31s %d",&endptr,&prot_minor);
                        if (iVar4 == 2) {
                          iVar4 = bcmp("wait",&endptr,5);
                          if (iVar4 == 0) {
                            logmsg("Told to sleep for %d seconds",(ulong)(uint)prot_minor);
                            uVar22 = prot_minor << 2;
                            uVar20 = (int)uVar22 >> 0x1f & uVar22;
                            do {
                              if ((int)uVar22 < 1) goto LAB_001069dc;
                              iVar4 = wait_ms(0xfa);
                              if (got_exit_signal != 0) {
                                uVar20 = uVar22 - 1;
                                goto LAB_001069dc;
                              }
                              uVar22 = uVar22 - 1;
                            } while (iVar4 == 0);
                            puVar11 = (uint *)__errno_location();
                            uVar20 = *puVar11;
                            pcVar12 = strerror(uVar20);
                            logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar20,pcVar12);
                            uVar20 = uVar22;
LAB_001069dc:
                            if (uVar20 == 0) {
                              logmsg("Continuing after sleeping %d seconds",(ulong)(uint)prot_minor)
                              ;
                            }
                          }
                          else {
                            logmsg("Unknown command in reply command section");
                          }
                        }
                        pcVar12 = strchr(cmd,10);
                        cmd = pcVar12 + 1;
                      } while ((pcVar12 != (char *)0x0) && (pcVar12 = cmd, *cmd != '\0'));
                    }
                    cmd = pcVar12;
                    free((void *)cmdsize);
                    req.open = bVar27 && pcVar10 == (char *)0x0;
                    prevtestno = req.testno;
                    prevpartno = req.partno;
                    goto LAB_00106888;
                  }
                  logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent",
                         sVar25 - count,sVar25);
                }
                free(cmd);
                free((void *)cmdsize);
              }
            }
            else {
              free(cmd);
              free((void *)cmdsize);
            }
          }
          else {
            pcVar10 = test2file(req.testno);
            uStack_24b80 = 0;
            uStack_24b48 = 0;
            uStack_24b40 = 0;
            uStack_24b58 = 0;
            uStack_24b50 = 0;
            uStack_24b68 = 0;
            uStack_24b60 = 0;
            uStack_24b78 = 0;
            uStack_24b70 = 0;
            endptr = (char *)0x61746164;
            if (req.partno != 0) {
              curl_msnprintf((char *)&endptr,0x50,"data%ld");
            }
            pFVar16 = fopen64(pcVar10,"rb");
            if (pFVar16 == (FILE *)0x0) {
              puVar11 = (uint *)__errno_location();
              uVar20 = *puVar11;
              pcVar12 = strerror(uVar20);
              logmsg("fopen() failed with error: %d %s",(ulong)uVar20,pcVar12);
              logmsg("Error opening file: %s");
              logmsg("Couldn\'t open test file");
            }
            else {
              iVar4 = getpart(&cmd,&count,"reply",(char *)&endptr,(FILE *)pFVar16);
              fclose(pFVar16);
              pcVar12 = cmd;
              if (iVar4 == 0) {
                if (got_exit_signal == 0) {
                  pFVar16 = fopen64(pcVar10,"rb");
                  if (pFVar16 == (FILE *)0x0) {
                    puVar11 = (uint *)__errno_location();
                    uVar20 = *puVar11;
                    pcVar12 = strerror(uVar20);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar20,pcVar12);
                    logmsg("Error opening file: %s");
                    logmsg("Couldn\'t open test file");
                    pcVar12 = cmd;
                  }
                  else {
                    iVar4 = getpart((char **)&cmdsize,(size_t *)&prot_major,"reply","postcmd",
                                    (FILE *)pFVar16);
                    fclose(pFVar16);
                    if (iVar4 == 0) goto LAB_00106544;
                    logmsg("getpart() failed with error: %d");
                    pcVar12 = cmd;
                  }
                }
                goto LAB_0010687c;
              }
              logmsg("getpart() failed with error: %d");
            }
          }
        }
LAB_00106888:
        if (got_exit_signal != 0) break;
        if (req.testno != -3 && req.testno < 0) {
          pcVar12 = "special request received, no persistency";
LAB_00106b3c:
          logmsg(pcVar12);
          break;
        }
        if (req.open == false) {
          pcVar12 = "instructed to close connection after server-reply";
          goto LAB_00106b3c;
        }
        logmsg("=> persistent connection request ended, awaits new request");
      } while ((req.open != false) || (req.testno == -3));
LAB_00106ac4:
      _Var5 = _Stack_24c14;
      iVar6 = iStack_24c54;
      uVar7 = (ulong)uStack_24c18;
      iVar4 = iStack_24c40;
      if (got_exit_signal != 0) goto LAB_00106b68;
      logmsg("====> Client disconnect");
      close(iVar6);
      if (serverlogslocked == '\x01') {
        serverlogslocked = '\0';
        clear_advisor_read_lock("log/serverlogs.lock");
      }
      bVar27 = false;
      uVar20 = uStack_24c18;
      _Var1 = _Stack_24c14;
    } while (req.testno != -6);
  }
  else {
    pcStack_24c20 = pcVar12;
    puVar11 = (uint *)__errno_location();
    uVar20 = *puVar11;
    pcVar12 = strerror(uVar20);
    pcVar10 = "setsockopt(SO_REUSEADDR) failed with error: (%d) %s";
LAB_00105023:
    logmsg(pcVar10,(ulong)uVar20,pcVar12);
LAB_00105108:
    bVar27 = true;
  }
  close(iStack_24c40);
  pcVar12 = pcStack_24c20;
LAB_00105119:
  if (got_exit_signal != 0) {
    logmsg("signalled to die");
  }
  if (!bVar27) {
    unlink(pcVar12);
  }
  if (serverlogslocked == '\x01') {
    serverlogslocked = '\0';
    clear_advisor_read_lock("log/serverlogs.lock");
  }
  if (old_sighup_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(1,(__sighandler_t)old_sighup_handler);
  }
  if (old_sigpipe_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xd,(__sighandler_t)old_sigpipe_handler);
  }
  if (old_sigalrm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xe,(__sighandler_t)old_sigalrm_handler);
  }
  if (old_sigint_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(2,(__sighandler_t)old_sigint_handler);
  }
  if (old_sigterm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xf,(__sighandler_t)old_sigterm_handler);
  }
  if (got_exit_signal != 0) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",ipv_inuse,uVar7,
           (long)_Var5,(ulong)(uint)exit_signal);
    raise(exit_signal);
  }
  logmsg("========> rtspd quits");
  return 0;
code_r0x00105d39:
  pcVar15 = strchr(pcVar12,10);
  pcVar12 = pcVar15 + 1;
  if (pcVar15 == (char *)0x0) goto LAB_00105d4c;
  goto LAB_00105cea;
}

Assistant:

int main(int argc, char *argv[])
{
  srvr_sockaddr_union_t me;
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  int flag;
  unsigned short port = DEFAULT_PORT;
  const char *pidname = ".rtsp.pid";
  struct httprequest req;
  int rc;
  int error;
  int arg = 1;
  long pid;

  memset(&req, 0, sizeof(req));

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("rtspd IPv4%s"
             "\n"
             ,
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv4", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           (ulnum < 1025UL) || (ulnum > 65535UL)) {
          fprintf(stderr, "rtspd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else if(!strcmp("--srcdir", argv[arg])) {
      arg++;
      if(argc>arg) {
        path = argv[arg];
        arg++;
      }
    }
    else {
      puts("Usage: rtspd [option]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --port [port]\n"
           " --srcdir [path]");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);
#endif

  install_signal_handlers();

  pid = (long)getpid();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  flag = 1;
  if(0 != setsockopt(sock, SOL_SOCKET, SO_REUSEADDR,
            (void *)&flag, sizeof(flag))) {
    error = SOCKERRNO;
    logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

#ifdef ENABLE_IPV6
  if(!use_ipv6) {
#endif
    memset(&me.sa4, 0, sizeof(me.sa4));
    me.sa4.sin_family = AF_INET;
    me.sa4.sin_addr.s_addr = INADDR_ANY;
    me.sa4.sin_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa4));
#ifdef ENABLE_IPV6
  }
  else {
    memset(&me.sa6, 0, sizeof(me.sa6));
    me.sa6.sin6_family = AF_INET6;
    me.sa6.sin6_addr = in6addr_any;
    me.sa6.sin6_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa6));
  }
#endif /* ENABLE_IPV6 */
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("Error binding socket on port %hu: (%d) %s",
           port, error, strerror(error));
    goto server_cleanup;
  }

  logmsg("Running %s version on port %d", ipv_inuse, (int)port);

  /* start accepting connections */
  rc = listen(sock, 5);
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("listen() failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  /*
  ** As soon as this server writes its pid file the test harness will
  ** attempt to connect to this server and initiate its verification.
  */

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile)
    goto server_cleanup;

  for(;;) {
    msgsock = accept(sock, NULL, NULL);

    if(got_exit_signal)
      break;
    if(CURL_SOCKET_BAD == msgsock) {
      error = SOCKERRNO;
      logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",
             error, strerror(error));
      break;
    }

    /*
    ** As soon as this server acepts a connection from the test harness it
    ** must set the server logs advisor read lock to indicate that server
    ** logs should not be read until this lock is removed by this server.
    */

    set_advisor_read_lock(SERVERLOGS_LOCK);
    serverlogslocked = 1;

    logmsg("====> Client connect");

#ifdef TCP_NODELAY
    /*
     * Disable the Nagle algorithm to make it easier to send out a large
     * response in many small segments to torture the clients more.
     */
    flag = 1;
    if(setsockopt(msgsock, IPPROTO_TCP, TCP_NODELAY,
                   (void *)&flag, sizeof(flag)) == -1) {
      logmsg("====> TCP_NODELAY failed");
    }
#endif

    /* initialization of httprequest struct is done in get_request(), but due
       to pipelining treatment the pipelining struct field must be initialized
       previously to FALSE every time a new connection arrives. */

    req.pipelining = FALSE;

    do {
      if(got_exit_signal)
        break;

      if(get_request(msgsock, &req))
        /* non-zero means error, break out of loop */
        break;

      if(prevbounce) {
        /* bounce treatment requested */
        if((req.testno == prevtestno) &&
           (req.partno == prevpartno)) {
          req.partno++;
          logmsg("BOUNCE part number to %ld", req.partno);
        }
        else {
          prevbounce = FALSE;
          prevtestno = -1;
          prevpartno = -1;
        }
      }

      send_doc(msgsock, &req);
      if(got_exit_signal)
        break;

      if((req.testno < 0) && (req.testno != DOCNUMBER_CONNECT)) {
        logmsg("special request received, no persistency");
        break;
      }
      if(!req.open) {
        logmsg("instructed to close connection after server-reply");
        break;
      }

      if(req.open)
        logmsg("=> persistent connection request ended, awaits new request");
      /* if we got a CONNECT, loop and get another request as well! */
    } while(req.open || (req.testno == DOCNUMBER_CONNECT));

    if(got_exit_signal)
      break;

    logmsg("====> Client disconnect");
    sclose(msgsock);
    msgsock = CURL_SOCKET_BAD;

    if(serverlogslocked) {
      serverlogslocked = 0;
      clear_advisor_read_lock(SERVERLOGS_LOCK);
    }

    if(req.testno == DOCNUMBER_QUIT)
      break;
  }

server_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(got_exit_signal)
    logmsg("signalled to die");

  if(wrotepidfile)
    unlink(pidname);

  if(serverlogslocked) {
    serverlogslocked = 0;
    clear_advisor_read_lock(SERVERLOGS_LOCK);
  }

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",
           ipv_inuse, (int)port, pid, exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("========> rtspd quits");
  return 0;
}